

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absPth.c
# Opt level: O3

void * Abs_ProverThread(void *pArg)

{
  int iVar1;
  char *format;
  int level;
  Pdr_Par_t Pars;
  Pdr_Par_t local_d0;
  Aig_Man_t *pAig;
  
  Pdr_ManSetDefaultParams(&local_d0);
  local_d0.fSilent = 1;
  local_d0.RunId = *(int *)((long)pArg + 0xc);
  local_d0.pFuncStop = Abs_CallBackToStop;
  pAig = *pArg;
  iVar1 = Pdr_ManSolve(pAig,&local_d0);
  level = (int)pAig;
  if (iVar1 == 1) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&g_mutex);
    if (iVar1 != 0) {
      __assert_fail("status == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absPth.c"
                    ,0x6d,"void *Abs_ProverThread(void *)");
    }
    g_fAbstractionProved = 1;
    level = 0xe25cc0;
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&g_mutex);
    if (iVar1 != 0) {
      __assert_fail("status == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absPth.c"
                    ,0x6f,"void *Abs_ProverThread(void *)");
    }
    if (*(int *)((long)pArg + 8) == 0) goto LAB_00620015;
    format = "Proved abstraction %d.\n";
  }
  else {
    if (*(int *)((long)pArg + 8) == 0) goto LAB_00620015;
    if (iVar1 == 0) {
      format = "Disproved abstraction %d.\n";
    }
    else {
      if (iVar1 != -1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absPth.c"
                      ,0x7a,"void *Abs_ProverThread(void *)");
      }
      format = "Cancelled abstraction %d.\n";
    }
  }
  Abc_Print(level,format,(ulong)*(uint *)((long)pArg + 0xc));
LAB_00620015:
  Aig_ManStop(*pArg);
  free(pArg);
  pthread_exit((void *)0x0);
}

Assistant:

void * Abs_ProverThread( void * pArg )
{
    Abs_ThData_t * pThData = (Abs_ThData_t *)pArg;
    Pdr_Par_t Pars, * pPars = &Pars;
    int RetValue, status;
    // call PDR
    Pdr_ManSetDefaultParams( pPars );
    pPars->fSilent   = 1;
    pPars->RunId     = pThData->RunId;
    pPars->pFuncStop = Abs_CallBackToStop;
    RetValue = Pdr_ManSolve( pThData->pAig, pPars );
    // update the result
    if ( RetValue == 1 )
    {
        status = pthread_mutex_lock(&g_mutex);  assert( status == 0 );
        g_fAbstractionProved = 1;
        status = pthread_mutex_unlock(&g_mutex);  assert( status == 0 );
    }
    // quit this thread
    if ( pThData->fVerbose )
    {
        if ( RetValue == 1 )
            Abc_Print( 1, "Proved abstraction %d.\n", pThData->RunId );
        else if ( RetValue == 0 )
            Abc_Print( 1, "Disproved abstraction %d.\n", pThData->RunId );
        else if ( RetValue == -1 )
            Abc_Print( 1, "Cancelled abstraction %d.\n", pThData->RunId );
        else assert( 0 );
    }
    // free memory
    Aig_ManStop( pThData->pAig );
    ABC_FREE( pThData );
    // quit this thread
    pthread_exit( NULL );
    assert(0);
    return NULL;
}